

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::addGlobals(Instrumenter *this,size_t numFuncs)

{
  pointer *ppNVar1;
  Module *pMVar2;
  pointer puVar3;
  Function *pFVar4;
  char *pcVar5;
  iterator __position;
  pointer pNVar6;
  long *plVar7;
  long *plVar8;
  Name *name;
  pointer pNVar9;
  pointer puVar10;
  Name root;
  Name root_00;
  undefined1 auVar11 [16];
  string_view sVar12;
  string_view local_b0;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 auStack_58 [8];
  anon_class_8_1_8991fb9c addGlobal;
  
  if (this->config->storageKind == InGlobals) {
    pMVar2 = this->wasm;
    auVar11 = wasm::IString::interned(0x11,"monotonic_counter",0);
    addGlobal.this = (Instrumenter *)0x0;
    root.super_IString.str._M_str = (char *)auStack_58;
    root.super_IString.str._M_len = auVar11._8_8_;
    auStack_58 = (undefined1  [8])pMVar2;
    sVar12 = (string_view)
             Names::getValidName(auVar11._0_8_,root,(function<bool_(wasm::Name)> *)auStack_58);
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
    ::_M_manager((_Any_data *)auStack_58,(_Any_data *)auStack_58,__destroy_functor);
    (this->counterGlobal).super_IString.str = sVar12;
    local_a0 = &this->functionGlobals;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve(local_a0,numFuncs);
    puVar3 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar7 = local_98[0];
    for (puVar10 = (this->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      local_98[0] = local_88;
      pFVar4 = (puVar10->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar4->super_Importable).module + 8) == (char *)0x0) {
        pMVar2 = this->wasm;
        pcVar5 = *(char **)((long)&(pFVar4->super_Importable).super_Named + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,pcVar5,
                   pcVar5 + *(long *)&(pFVar4->super_Importable).super_Named);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_98);
        local_78 = &local_68;
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_68 = *plVar8;
          uStack_60 = (undefined4)plVar7[3];
          uStack_5c = *(undefined4 *)((long)plVar7 + 0x1c);
        }
        else {
          local_68 = *plVar8;
          local_78 = (long *)*plVar7;
        }
        local_70 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        auVar11 = wasm::IString::interned(local_70,local_78,0);
        addGlobal.this = (Instrumenter *)0x0;
        root_00.super_IString.str._M_str = auStack_58;
        root_00.super_IString.str._M_len = auVar11._8_8_;
        auStack_58 = (undefined1  [8])pMVar2;
        sVar12 = (string_view)
                 Names::getValidName(auVar11._0_8_,root_00,
                                     (function<bool_(wasm::Name)> *)
                                     std::
                                     _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
                                     ::_M_manager);
        std::
        _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
        ::_M_manager((_Any_data *)auStack_58,(_Any_data *)auStack_58,__destroy_functor);
        __position._M_current =
             (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_b0 = sVar12;
        if (__position._M_current ==
            (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                    (local_a0,__position,(Name *)&local_b0);
        }
        else {
          local_b0._M_len = sVar12._M_len;
          local_b0._M_str = sVar12._M_str;
          ((__position._M_current)->super_IString).str._M_len = local_b0._M_len;
          ((__position._M_current)->super_IString).str._M_str = local_b0._M_str;
          ppNVar1 = &(this->functionGlobals).
                     super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppNVar1 = *ppNVar1 + 1;
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        plVar7 = local_98[0];
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
          plVar7 = local_98[0];
        }
      }
      local_98[0] = plVar7;
      plVar7 = local_98[0];
    }
    local_98[0] = plVar7;
    auStack_58 = (undefined1  [8])this;
    addGlobals::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)auStack_58,(Name)(this->counterGlobal).super_IString.str);
    pNVar9 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar9 != pNVar6) {
      do {
        addGlobals::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)auStack_58,(Name)(pNVar9->super_IString).str);
        pNVar9 = pNVar9 + 1;
      } while (pNVar9 != pNVar6);
    }
  }
  return;
}

Assistant:

void Instrumenter::addGlobals(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InGlobals) {
    // Don't need globals
    return;
  }
  // Create fresh global names (over-reserves, but that's ok)
  counterGlobal = Names::getValidGlobalName(*wasm, "monotonic_counter");
  functionGlobals.reserve(numFuncs);
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    functionGlobals.push_back(
      Names::getValidGlobalName(*wasm, func->name.toString() + "_timestamp"));
  });

  // Create and add new globals
  auto addGlobal = [&](Name name) {
    auto global = Builder::makeGlobal(
      name,
      Type::i32,
      Builder(*wasm).makeConst(Literal::makeZero(Type::i32)),
      Builder::Mutable);
    global->hasExplicitName = true;
    wasm->addGlobal(std::move(global));
  };
  addGlobal(counterGlobal);
  for (auto& name : functionGlobals) {
    addGlobal(name);
  }
}